

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O0

_Bool rcnb_decode_short(wchar_t *value_in,char **value_out)

{
  undefined1 *puVar1;
  wchar_t wVar2;
  long *in_RSI;
  wchar_t *in_RDI;
  wchar_t result;
  wchar_t idx [4];
  _Bool reverse;
  uint local_40;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t local_2c;
  _Bool local_1;
  
  wVar2 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,*in_RDI);
  if (wVar2 < L'\0') {
    local_38 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,in_RDI[2]);
    local_34 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,in_RDI[3]);
    local_30 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,*in_RDI);
    local_2c = find(L"bBƀƁƃƄƅßÞþ",10,in_RDI[1]);
  }
  else {
    local_38 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,*in_RDI);
    local_34 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,in_RDI[1]);
    local_30 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,in_RDI[2]);
    local_2c = find(L"bBƀƁƃƄƅßÞþ",10,in_RDI[3]);
  }
  if ((((local_38 < L'\0') || (local_34 < L'\0')) || (local_30 < L'\0')) || (local_2c < L'\0')) {
    local_1 = false;
  }
  else {
    local_40 = local_38 * 0x8ca + local_34 * 0x96 + local_30 * 10 + local_2c;
    if ((int)local_40 < 0x8000) {
      if (wVar2 < L'\0') {
        local_40 = local_40 | 0x8000;
      }
      puVar1 = (undefined1 *)*in_RSI;
      *in_RSI = (long)(puVar1 + 1);
      *puVar1 = (char)(local_40 >> 8);
      puVar1 = (undefined1 *)*in_RSI;
      *in_RSI = (long)(puVar1 + 1);
      *puVar1 = (char)local_40;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool rcnb_decode_short(const wchar_t* value_in, char** value_out)
{
    bool reverse = find(cr, sr, *value_in) < 0;
    int idx[4];
    if (!reverse) {
        idx[0] = find(cr, sr, *value_in);
        idx[1] = find(cc, sc, *(value_in + 1));
        idx[2] = find(cn, sn, *(value_in + 2));
        idx[3] = find(cb, sb, *(value_in + 3));
    } else {
        idx[0] = find(cr, sr, *(value_in + 2));
        idx[1] = find(cc, sc, *(value_in + 3));
        idx[2] = find(cn, sn, *value_in);
        idx[3] = find(cb, sb, *(value_in + 1));
    }
    if (idx[0] < 0 || idx[1] < 0 || idx[2] < 0 || idx[3] < 0)
        return false;
    int result = idx[0] * scnb + idx[1] * snb + idx[2] * sb + idx[3];
    if (result > 0x7FFF)
        return false;
    result = reverse ? result | 0x8000 : result;
    *(*value_out)++ = (char)(result >> 8);
    *(*value_out)++ = (char)(result & 0xFF);
    return true;
}